

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::ProcessTransfers(BackwardPass *this,Instr *instr)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  StackSym *pSVar4;
  ObjectSymInfo *pOVar5;
  undefined4 *puVar6;
  Type *pppBVar7;
  Type pJVar8;
  _func_void *p_Var9;
  BVSparseNode *pBVar10;
  _func_void *p_Var11;
  BVSparseNode *pBVar12;
  PropertySym *pPVar13;
  undefined1 auStack_78 [8];
  BVSparse<Memory::JitArenaAllocator> equivFields;
  BVSparse<Memory::JitArenaAllocator> transferFields;
  
  if (((this->tag == DeadStorePhase) &&
      (this->currentBlock->upwardExposedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (instr->m_opcode == Ld_A)) {
    pSVar4 = IR::Opnd::GetStackSym(instr->m_dst);
    if (pSVar4 != (StackSym *)0x0) {
      pSVar4 = IR::Opnd::GetStackSym(instr->m_dst);
      if ((pSVar4->field_0x1a & 1) == 0) {
        pSVar4 = IR::Opnd::GetStackSym(instr->m_dst);
        bVar3 = StackSym::HasObjectInfo(pSVar4);
        if ((bVar3) && (instr->m_src1 != (Opnd *)0x0)) {
          pSVar4 = IR::Opnd::GetStackSym(instr->m_src1);
          if (pSVar4 != (StackSym *)0x0) {
            pSVar4 = IR::Opnd::GetStackSym(instr->m_src1);
            if ((pSVar4->field_0x1a & 1) == 0) {
              pSVar4 = IR::Opnd::GetStackSym(instr->m_src1);
              bVar3 = StackSym::HasObjectInfo(pSVar4);
              if (bVar3) {
                pSVar4 = IR::Opnd::GetStackSym(instr->m_dst);
                pOVar5 = StackSym::GetObjectInfo(pSVar4);
                pPVar13 = pOVar5->m_propertySymList;
                pJVar1 = this->tempAlloc;
                equivFields.lastUsedNodePrevNextField = (Type)0x0;
                if (pPVar13 != (PropertySym *)0x0) {
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  do {
                    if (pPVar13->m_stackSym != pSVar4) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar6 = 1;
                      bVar3 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                         ,0x1f98,"(dstPropertySym->m_stackSym == dstStackSym)",
                                         "dstPropertySym->m_stackSym == dstStackSym");
                      if (!bVar3) goto LAB_003e3e15;
                      *puVar6 = 0;
                    }
                    BVSparse<Memory::JitArenaAllocator>::Set
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               &equivFields.lastUsedNodePrevNextField,(pPVar13->super_Sym).m_id);
                    pPVar13 = pPVar13->m_nextInStackSymList;
                  } while (pPVar13 != (PropertySym *)0x0);
                }
                pSVar4 = IR::Opnd::GetStackSym(instr->m_src1);
                pOVar5 = StackSym::GetObjectInfo(pSVar4);
                pPVar13 = pOVar5->m_propertySymList;
                equivFields.lastFoundIndex = (Type_conflict)this->tempAlloc;
                auStack_78 = (undefined1  [8])0x0;
                equivFields.head = (Type_conflict)0x0;
                if (pPVar13 != (PropertySym *)0x0) {
                  equivFields.alloc = (Type)auStack_78;
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  do {
                    pppBVar7 = &equivFields.lastUsedNodePrevNextField;
                    do {
                      pppBVar7 = (Type *)*pppBVar7;
                      if (pppBVar7 == (Type *)0x0) goto LAB_003e3d8e;
                    } while ((BVSparseNode<Memory::JitArenaAllocator> *)pppBVar7[2] ==
                             (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
                    if (pppBVar7 == (Type *)0x0) break;
                    if (pPVar13->m_stackSym != pSVar4) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar6 = 1;
                      bVar3 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                         ,0x1fa3,"(srcPropertySym->m_stackSym == srcStackSym)",
                                         "srcPropertySym->m_stackSym == srcStackSym");
                      if (!bVar3) {
LAB_003e3e15:
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      *puVar6 = 0;
                    }
                    if (pPVar13->m_propertyEquivSet != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
                      BVSparse<Memory::JitArenaAllocator>::And
                                ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
                                 (BVSparse<Memory::JitArenaAllocator> *)
                                 &equivFields.lastUsedNodePrevNextField,pPVar13->m_propertyEquivSet)
                      ;
                      pJVar8 = (Type)auStack_78;
                      do {
                        pJVar8 = (Type)(pJVar8->super_ArenaAllocator).
                                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       .super_Allocator.outOfMemoryFunc;
                        if (pJVar8 == (Type)0x0) goto LAB_003e3d81;
                      } while ((pJVar8->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.bigBlocks == (BigBlock *)0x0);
                      if (pJVar8 != (Type)0x0) {
                        BVSparse<Memory::JitArenaAllocator>::
                        for_each<&BVUnitT<unsigned_long>::Minus>
                                  ((BVSparse<Memory::JitArenaAllocator> *)
                                   &equivFields.lastUsedNodePrevNextField,
                                   (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
                        BVSparse<Memory::JitArenaAllocator>::Set
                                  (this->currentBlock->upwardExposedFields,(pPVar13->super_Sym).m_id
                                  );
                      }
                    }
LAB_003e3d81:
                    pPVar13 = pPVar13->m_nextInStackSymList;
                  } while (pPVar13 != (PropertySym *)0x0);
                }
LAB_003e3d8e:
                if (auStack_78 != (undefined1  [8])0x0) {
                  p_Var11 = *(_func_void **)&equivFields.lastFoundIndex[5].startIndex;
                  do {
                    p_Var9 = (_func_void *)auStack_78;
                    auStack_78 = *(undefined1 (*) [8])p_Var9;
                    *(_func_void **)p_Var9 = p_Var11;
                    p_Var11 = p_Var9;
                  } while (auStack_78 != (undefined1  [8])0x0);
                  *(_func_void **)&equivFields.lastFoundIndex[5].startIndex = p_Var9;
                }
                if (equivFields.lastUsedNodePrevNextField != (Type)0x0) {
                  pBVar12 = pJVar1->bvFreeList;
                  do {
                    pBVar10 = (BVSparseNode *)equivFields.lastUsedNodePrevNextField;
                    equivFields.lastUsedNodePrevNextField = &pBVar10->next->next;
                    pBVar10->next = pBVar12;
                    pBVar12 = pBVar10;
                  } while ((Type)equivFields.lastUsedNodePrevNextField != (Type)0x0);
                  pJVar1->bvFreeList = pBVar10;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessTransfers(IR::Instr * instr)
{
    if (this->tag == Js::DeadStorePhase &&
        this->currentBlock->upwardExposedFields &&
        instr->m_opcode == Js::OpCode::Ld_A &&
        instr->GetDst()->GetStackSym() &&
        !instr->GetDst()->GetStackSym()->IsTypeSpec() &&
        instr->GetDst()->GetStackSym()->HasObjectInfo() &&
        instr->GetSrc1() &&
        instr->GetSrc1()->GetStackSym() &&
        !instr->GetSrc1()->GetStackSym()->IsTypeSpec() &&
        instr->GetSrc1()->GetStackSym()->HasObjectInfo())
    {
        StackSym * dstStackSym = instr->GetDst()->GetStackSym();
        PropertySym * dstPropertySym = dstStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> transferFields(this->tempAlloc);
        while (dstPropertySym != nullptr)
        {
            Assert(dstPropertySym->m_stackSym == dstStackSym);
            transferFields.Set(dstPropertySym->m_id);
            dstPropertySym = dstPropertySym->m_nextInStackSymList;
        }

        StackSym * srcStackSym = instr->GetSrc1()->GetStackSym();
        PropertySym * srcPropertySym = srcStackSym->GetObjectInfo()->m_propertySymList;
        BVSparse<JitArenaAllocator> equivFields(this->tempAlloc);

        while (srcPropertySym != nullptr && !transferFields.IsEmpty())
        {
            Assert(srcPropertySym->m_stackSym == srcStackSym);
            if (srcPropertySym->m_propertyEquivSet)
            {
                equivFields.And(&transferFields, srcPropertySym->m_propertyEquivSet);
                if (!equivFields.IsEmpty())
                {
                    transferFields.Minus(&equivFields);
                    this->currentBlock->upwardExposedFields->Set(srcPropertySym->m_id);
                }
            }
            srcPropertySym = srcPropertySym->m_nextInStackSymList;
        }
    }
}